

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  U32 dictID;
  ZSTD_DDictHashSet *hashSet;
  ZSTD_DDict *pZVar1;
  ulong uVar2;
  U32 UVar3;
  
  if ((dctx->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
     (hashSet = dctx->ddictSet, hashSet != (ZSTD_DDictHashSet *)0x0)) {
    if (dctx->ddict != (ZSTD_DDict *)0x0) {
      dictID = (dctx->fParams).dictID;
      uVar2 = ZSTD_DDictHashSet_getIndex(hashSet,dictID);
      do {
        pZVar1 = hashSet->ddictPtrTable[uVar2];
        if (pZVar1 == (ZSTD_DDict *)0x0) {
          UVar3 = 0;
        }
        else {
          UVar3 = pZVar1->dictID;
        }
      } while ((UVar3 != dictID) &&
              (uVar2 = (uVar2 & hashSet->ddictPtrTableSize - 1) + 1, UVar3 != 0));
      if (pZVar1 != (ZSTD_DDict *)0x0) {
        ZSTD_clearDict(dctx);
        dctx->dictID = (dctx->fParams).dictID;
        dctx->ddict = pZVar1;
        dctx->dictUses = ZSTD_use_indefinitely;
      }
    }
    return;
  }
  __assert_fail("dctx->refMultipleDDicts && dctx->ddictSet",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9cb1,"void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *)");
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}